

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setMinimumSize(QWidget *this,int minw,int minh)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  QWidgetPrivate *this_00;
  int iVar4;
  int iVar5;
  bool bVar6;
  QWidgetData *pQVar7;
  QWExtra *pQVar8;
  int h;
  int w;
  long in_FS_OFFSET;
  int minh_local;
  int minw_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  minh_local = minh;
  minw_local = minw;
  bVar6 = QWidgetPrivate::setMinimumSize_helper(this_00,&minw_local,&minh_local);
  if (!bVar6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    goto LAB_002f64da;
  }
  pQVar7 = this->data;
  if (((pQVar7->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    QWidgetPrivate::setConstraints_sys(this_00);
    pQVar7 = this->data;
  }
  iVar5 = minw_local;
  iVar4 = minh_local;
  w = ((pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i) + 1;
  if (w < minw_local) {
    h = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
LAB_002f6433:
    uVar3 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if (w < minw_local) {
      w = minw_local;
    }
    bVar2 = pQVar7->field_0x10;
    if (h < minh_local) {
      h = minh_local;
    }
    resize(this,w,h);
    setAttribute(this,WA_Resized,(bool)((byte)(uVar3 >> 10) & 1));
    if ((bVar2 & 2) != 0) {
      puVar1 = &this->data->field_0x10;
      *(uint *)puVar1 = *(uint *)puVar1 | 2;
    }
  }
  else {
    h = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
    if (h < minh_local) goto LAB_002f6433;
  }
  pQVar8 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar8->proxyWidget != (QGraphicsProxyWidget *)0x0) {
    QGraphicsLayoutItem::setMinimumSize
              (&(pQVar8->proxyWidget->super_QGraphicsWidget).super_QGraphicsLayoutItem,(double)iVar5
               ,(double)iVar4);
    pQVar8 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  }
  if (pQVar8->minw == pQVar8->maxw) {
    bVar6 = pQVar8->minh == pQVar8->maxh;
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QWidgetPrivate::updateGeometry_helper(this_00,bVar6);
    return;
  }
LAB_002f64da:
  __stack_chk_fail();
}

Assistant:

void QWidget::setMinimumSize(int minw, int minh)
{
    Q_D(QWidget);
    if (!d->setMinimumSize_helper(minw, minh))
        return;

    if (isWindow())
        d->setConstraints_sys();
    if (minw > width() || minh > height()) {
        bool resized = testAttribute(Qt::WA_Resized);
        bool maximized = isMaximized();
        resize(qMax(minw,width()), qMax(minh,height()));
        setAttribute(Qt::WA_Resized, resized); //not a user resize
        if (maximized)
            data->window_state = data->window_state | Qt::WindowMaximized;
    }
#if QT_CONFIG(graphicsview)
    if (d->extra) {
        if (d->extra->proxyWidget)
            d->extra->proxyWidget->setMinimumSize(minw, minh);
    }
#endif
    d->updateGeometry_helper(d->extra->minw == d->extra->maxw && d->extra->minh == d->extra->maxh);
}